

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void pugi::impl::anon_unknown_0::node_output
               (xml_buffered_writer *writer,xml_node *node,char_t *indent,uint flags,uint depth)

{
  char cVar1;
  char_t *pcVar2;
  void *pvVar3;
  xml_node_struct *pxVar4;
  int iVar5;
  undefined4 in_register_0000000c;
  xml_node_struct *pxVar6;
  size_t sVar7;
  char *pcVar8;
  void *extraout_RDX;
  void *__buf;
  void *__buf_00;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  xml_node_struct *__buf_01;
  void *extraout_RDX_06;
  uint uVar9;
  char *pcVar10;
  bool bVar11;
  xml_node local_40;
  char_t *local_38;
  
  bVar11 = (flags & 5) != 1;
  sVar7 = CONCAT71((int7)(CONCAT44(in_register_0000000c,flags) >> 8),depth == 0 || bVar11);
  uVar9 = depth;
  if (depth != 0 && !bVar11) {
    do {
      pvVar3 = (void *)strlength(indent);
      xml_buffered_writer::write(writer,(int)indent,pvVar3,sVar7);
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  pxVar4 = node->_root;
  if (pxVar4 == (xml_node_struct *)0x0) {
    iVar5 = 0;
  }
  else {
    iVar5 = ((uint)pxVar4->header & 7) + 1;
  }
  if (7 < iVar5 - 1U) {
    __assert_fail("!\"Invalid node type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                  ,0xc84,
                  "void pugi::impl::(anonymous namespace)::node_output(xml_buffered_writer &, const xml_node &, const char_t *, unsigned int, unsigned int)"
                 );
  }
  pxVar6 = (xml_node_struct *)
           ((long)&switchD_00115884::switchdataD_001265ec +
           (long)(int)(&switchD_00115884::switchdataD_001265ec)[iVar5 - 1U]);
  switch(iVar5) {
  case 1:
    if (pxVar4 == (xml_node_struct *)0x0) {
      pxVar4 = (xml_node_struct *)0x0;
    }
    else {
      pxVar4 = pxVar4->first_child;
    }
    if (pxVar4 == (xml_node_struct *)0x0) {
      return;
    }
    do {
      local_40._root = pxVar4;
      node_output(writer,&local_40,indent,flags,depth);
      pxVar4 = pxVar4->next_sibling;
    } while (pxVar4 != (xml_node_struct *)0x0);
    return;
  case 2:
    pcVar10 = "";
    pcVar8 = "";
    if (pxVar4 != (xml_node_struct *)0x0) {
      pcVar8 = "";
      if (pxVar4->name != (char *)0x0) {
        pcVar8 = pxVar4->name;
      }
    }
    cVar1 = *pcVar8;
    pxVar6 = (xml_node_struct *)CONCAT71((int7)((ulong)pcVar8 >> 8),cVar1);
    if (cVar1 == '\0') {
      pcVar10 = ":anonymous";
    }
    if ((pxVar4 != (xml_node_struct *)0x0) && (cVar1 != '\0')) {
      pcVar10 = "";
      if (pxVar4->name != (char_t *)0x0) {
        pcVar10 = pxVar4->name;
      }
    }
    xml_buffered_writer::write(writer,0x3c,":anonymous",(size_t)pxVar6);
    pvVar3 = (void *)strlength(pcVar10);
    xml_buffered_writer::write(writer,(int)pcVar10,pvVar3,(size_t)pxVar6);
    node_output_attributes
              ((anon_unknown_0 *)writer,(xml_buffered_writer *)node,(xml_node *)(ulong)flags,
               (uint)pxVar6);
    pxVar4 = node->_root;
    if ((flags & 4) != 0) {
      if ((pxVar4 == (xml_node_struct *)0x0) || (pxVar4->first_child == (xml_node_struct *)0x0)) {
        xml_buffered_writer::write(writer,0x20,(void *)0x2f,0x3e);
        return;
      }
      local_38 = pcVar10;
      xml_buffered_writer::write(writer,0x3e,__buf_00,(size_t)pxVar6);
      if (node->_root == (xml_node_struct *)0x0) {
        pxVar4 = (xml_node_struct *)0x0;
      }
      else {
        pxVar4 = node->_root->first_child;
      }
      local_40._root = pxVar4;
      if (pxVar4 != (xml_node_struct *)0x0) {
        do {
          pxVar6 = (xml_node_struct *)(ulong)flags;
          local_40._root = pxVar4;
          node_output(writer,&local_40,indent,flags,depth + 1);
          pxVar4 = pxVar4->next_sibling;
          local_40._root = pxVar4;
        } while (pxVar4 != (xml_node_struct *)0x0);
      }
      xml_buffered_writer::write(writer,0x3c,(void *)0x2f,(size_t)pxVar6);
      pcVar2 = local_38;
      pvVar3 = (void *)strlength(local_38);
      xml_buffered_writer::write(writer,(int)pcVar2,pvVar3,(size_t)pxVar6);
      iVar5 = 0x3e;
      pvVar3 = extraout_RDX_06;
      goto LAB_00115cf6;
    }
    if ((pxVar4 == (xml_node_struct *)0x0) || (pxVar4->first_child == (xml_node_struct *)0x0)) {
      xml_buffered_writer::write(writer,0x20,(void *)0x2f,0x3e);
      return;
    }
    if (pxVar4 == (xml_node_struct *)0x0) {
      pxVar6 = (xml_node_struct *)0x0;
LAB_00115d2e:
      __buf_01 = (xml_node_struct *)0x0;
    }
    else {
      pxVar6 = pxVar4->first_child;
      if (pxVar4->first_child == (xml_node_struct *)0x0) goto LAB_00115d2e;
      __buf_01 = pxVar4->first_child->prev_sibling_c;
    }
    if (pxVar6 == __buf_01) {
      if (pxVar4 == (xml_node_struct *)0x0) {
        pxVar6 = (xml_node_struct *)0x0;
      }
      else {
        pxVar6 = pxVar4->first_child;
      }
      if ((pxVar6 == (xml_node_struct *)0x0) ||
         (uVar9 = (uint)pxVar6->header & 7, pxVar6 = (xml_node_struct *)(ulong)uVar9, uVar9 != 2)) {
        if (pxVar4 == (xml_node_struct *)0x0) {
          pxVar4 = (xml_node_struct *)0x0;
        }
        else {
          pxVar4 = pxVar4->first_child;
        }
        if ((pxVar4 == (xml_node_struct *)0x0) || ((pxVar4->header & 7) != 3)) goto LAB_00115d39;
      }
      xml_buffered_writer::write(writer,0x3e,__buf_01,(size_t)pxVar6);
      pxVar4 = node->_root;
      if (pxVar4 == (xml_node_struct *)0x0) {
        pxVar6 = (xml_node_struct *)0x0;
      }
      else {
        pxVar6 = pxVar4->first_child;
      }
      if ((pxVar6 == (xml_node_struct *)0x0) ||
         (uVar9 = (uint)pxVar6->header & 7, pxVar6 = (xml_node_struct *)(ulong)uVar9, uVar9 != 2)) {
        if (pxVar4 == (xml_node_struct *)0x0) {
          pxVar4 = (xml_node_struct *)0x0;
        }
        else {
          pxVar4 = pxVar4->first_child;
        }
        if (pxVar4 == (xml_node_struct *)0x0) {
          pcVar8 = "";
        }
        else {
          pcVar8 = "";
          if (pxVar4->value != (char_t *)0x0) {
            pcVar8 = pxVar4->value;
          }
        }
        text_output_cdata(writer,pcVar8);
      }
      else {
        if (pxVar4 == (xml_node_struct *)0x0) {
          pxVar4 = (xml_node_struct *)0x0;
        }
        else {
          pxVar4 = pxVar4->first_child;
        }
        if (pxVar4 == (xml_node_struct *)0x0) {
          pcVar8 = "";
        }
        else {
          pcVar8 = "";
          if (pxVar4->value != (char_t *)0x0) {
            pcVar8 = pxVar4->value;
          }
        }
        pxVar6 = (xml_node_struct *)(ulong)flags;
        text_output(writer,pcVar8,ctx_special_pcdata,flags);
      }
      xml_buffered_writer::write(writer,0x3c,(void *)0x2f,(size_t)pxVar6);
    }
    else {
LAB_00115d39:
      local_38 = pcVar10;
      xml_buffered_writer::write(writer,0x3e,(void *)0xa,(size_t)pxVar6);
      if (node->_root == (xml_node_struct *)0x0) {
        pxVar4 = (xml_node_struct *)0x0;
      }
      else {
        pxVar4 = node->_root->first_child;
      }
      local_40._root = pxVar4;
      if (pxVar4 != (xml_node_struct *)0x0) {
        do {
          pxVar6 = (xml_node_struct *)(ulong)flags;
          local_40._root = pxVar4;
          node_output(writer,&local_40,indent,flags,depth + 1);
          pxVar4 = pxVar4->next_sibling;
          local_40._root = pxVar4;
        } while (pxVar4 != (xml_node_struct *)0x0);
      }
      bVar11 = (flags & 1) == 0;
      pxVar6 = (xml_node_struct *)CONCAT71((int7)((ulong)pxVar6 >> 8),depth == 0 || bVar11);
      if (depth != 0 && !bVar11) {
        do {
          pvVar3 = (void *)strlength(indent);
          xml_buffered_writer::write(writer,(int)indent,pvVar3,(size_t)pxVar6);
          depth = depth - 1;
        } while (depth != 0);
      }
      xml_buffered_writer::write(writer,0x3c,(void *)0x2f,(size_t)pxVar6);
      pcVar10 = local_38;
    }
    pvVar3 = (void *)strlength(pcVar10);
    xml_buffered_writer::write(writer,(int)pcVar10,pvVar3,(size_t)pxVar6);
    xml_buffered_writer::write(writer,0x3e,(void *)0xa,(size_t)pxVar6);
    return;
  case 3:
    if (pxVar4 == (xml_node_struct *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = "";
      if (pxVar4->value != (char_t *)0x0) {
        pcVar8 = pxVar4->value;
      }
    }
    pxVar6 = (xml_node_struct *)(ulong)flags;
    text_output(writer,pcVar8,ctx_special_pcdata,flags);
    pvVar3 = extraout_RDX_01;
    break;
  case 4:
    if (pxVar4 == (xml_node_struct *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = "";
      if (pxVar4->value != (char_t *)0x0) {
        pcVar8 = pxVar4->value;
      }
    }
    text_output_cdata(writer,pcVar8);
    pvVar3 = extraout_RDX_02;
    break;
  case 5:
    sVar7 = 0x2d;
    xml_buffered_writer::write(writer,0x3c,(void *)0x21,0x2d);
    if (node->_root == (xml_node_struct *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar2 = node->_root->value;
      pcVar8 = "";
      if (pcVar2 != (char_t *)0x0) {
        pcVar8 = pcVar2;
      }
    }
    pvVar3 = (void *)strlength(pcVar8);
    xml_buffered_writer::write(writer,(int)pcVar8,pvVar3,sVar7);
    pxVar6 = (xml_node_struct *)0x3e;
    xml_buffered_writer::write(writer,0x2d,(void *)0x2d,0x3e);
    pvVar3 = extraout_RDX_00;
    break;
  default:
    xml_buffered_writer::write(writer,0x3c,(void *)0x3f,(size_t)pxVar6);
    pxVar4 = node->_root;
    pcVar10 = "";
    pcVar8 = "";
    if (pxVar4 != (xml_node_struct *)0x0) {
      pcVar8 = "";
      if (pxVar4->name != (char *)0x0) {
        pcVar8 = pxVar4->name;
      }
    }
    cVar1 = *pcVar8;
    sVar7 = CONCAT71((int7)((ulong)pcVar8 >> 8),cVar1);
    if (cVar1 == '\0') {
      pcVar10 = ":anonymous";
    }
    if ((pxVar4 != (xml_node_struct *)0x0) && (cVar1 != '\0')) {
      pcVar10 = "";
      if (pxVar4->name != (char_t *)0x0) {
        pcVar10 = pxVar4->name;
      }
    }
    pvVar3 = (void *)strlength(pcVar10);
    xml_buffered_writer::write(writer,(int)pcVar10,pvVar3,sVar7);
    pxVar6 = node->_root;
    pxVar4 = (xml_node_struct *)0x126431;
    pvVar3 = extraout_RDX;
    if (pxVar6 == (xml_node_struct *)0x0) {
LAB_00115ae5:
      if ((char)pxVar4->header != '\0') {
        xml_buffered_writer::write(writer,0x20,pvVar3,(size_t)pxVar6);
        if (node->_root == (xml_node_struct *)0x0) {
          pcVar8 = "";
        }
        else {
          pcVar2 = node->_root->value;
          pcVar8 = "";
          if (pcVar2 != (char_t *)0x0) {
            pcVar8 = pcVar2;
          }
        }
        pvVar3 = (void *)strlength(pcVar8);
        xml_buffered_writer::write(writer,(int)pcVar8,pvVar3,(size_t)pxVar6);
      }
    }
    else {
      uVar9 = (uint)pxVar6->header & 7;
      pvVar3 = (void *)(ulong)uVar9;
      if (uVar9 != 6) {
        if (pxVar6 != (xml_node_struct *)0x0) {
          pxVar6 = (xml_node_struct *)pxVar6->value;
          pxVar4 = (xml_node_struct *)0x126431;
          if (pxVar6 != (xml_node_struct *)0x0) {
            pxVar4 = pxVar6;
          }
        }
        goto LAB_00115ae5;
      }
      node_output_attributes
                ((anon_unknown_0 *)writer,(xml_buffered_writer *)node,(xml_node *)(ulong)flags,
                 (uint)pxVar6);
    }
    xml_buffered_writer::write(writer,0x3f,(void *)0x3e,(size_t)pxVar6);
    pvVar3 = extraout_RDX_03;
    break;
  case 8:
    xml_buffered_writer::write(writer,0x3c,(void *)0x21,0x44);
    pxVar6 = (xml_node_struct *)0x50;
    xml_buffered_writer::write(writer,0x54,(void *)0x59,0x50);
    if (node->_root == (xml_node_struct *)0x0) {
      pxVar4 = (xml_node_struct *)0x126431;
    }
    else {
      pxVar6 = (xml_node_struct *)node->_root->value;
      pxVar4 = (xml_node_struct *)0x126431;
      if (pxVar6 != (xml_node_struct *)0x0) {
        pxVar4 = pxVar6;
      }
    }
    pvVar3 = __buf;
    if ((char)pxVar4->header != '\0') {
      xml_buffered_writer::write(writer,0x20,__buf,(size_t)pxVar6);
      if (node->_root == (xml_node_struct *)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar2 = node->_root->value;
        pcVar8 = "";
        if (pcVar2 != (char_t *)0x0) {
          pcVar8 = pcVar2;
        }
      }
      pvVar3 = (void *)strlength(pcVar8);
      xml_buffered_writer::write(writer,(int)pcVar8,pvVar3,(size_t)pxVar6);
      pvVar3 = extraout_RDX_04;
    }
    xml_buffered_writer::write(writer,0x3e,pvVar3,(size_t)pxVar6);
    pvVar3 = extraout_RDX_05;
  }
  if ((flags & 4) != 0) {
    return;
  }
  iVar5 = 10;
LAB_00115cf6:
  xml_buffered_writer::write(writer,iVar5,pvVar3,(size_t)pxVar6);
  return;
}

Assistant:

PUGI__FN void node_output(xml_buffered_writer& writer, const xml_node& node, const char_t* indent, unsigned int flags, unsigned int depth)
	{
		const char_t* default_name = PUGIXML_TEXT(":anonymous");

		if ((flags & format_indent) != 0 && (flags & format_raw) == 0)
			for (unsigned int i = 0; i < depth; ++i) writer.write(indent);

		switch (node.type())
		{
		case node_document:
		{
			for (xml_node n = node.first_child(); n; n = n.next_sibling())
				node_output(writer, n, indent, flags, depth);
			break;
		}
			
		case node_element:
		{
			const char_t* name = node.name()[0] ? node.name() : default_name;

			writer.write('<');
			writer.write(name);

			node_output_attributes(writer, node, flags);

			if (flags & format_raw)
			{
				if (!node.first_child())
					writer.write(' ', '/', '>');
				else
				{
					writer.write('>');

					for (xml_node n = node.first_child(); n; n = n.next_sibling())
						node_output(writer, n, indent, flags, depth + 1);

					writer.write('<', '/');
					writer.write(name);
					writer.write('>');
				}
			}
			else if (!node.first_child())
				writer.write(' ', '/', '>', '\n');
			else if (node.first_child() == node.last_child() && (node.first_child().type() == node_pcdata || node.first_child().type() == node_cdata))
			{
				writer.write('>');

				if (node.first_child().type() == node_pcdata)
					text_output(writer, node.first_child().value(), ctx_special_pcdata, flags);
				else
					text_output_cdata(writer, node.first_child().value());

				writer.write('<', '/');
				writer.write(name);
				writer.write('>', '\n');
			}
			else
			{
				writer.write('>', '\n');
				
				for (xml_node n = node.first_child(); n; n = n.next_sibling())
					node_output(writer, n, indent, flags, depth + 1);

				if ((flags & format_indent) != 0 && (flags & format_raw) == 0)
					for (unsigned int i = 0; i < depth; ++i) writer.write(indent);
				
				writer.write('<', '/');
				writer.write(name);
				writer.write('>', '\n');
			}

			break;
		}
		
		case node_pcdata:
			text_output(writer, node.value(), ctx_special_pcdata, flags);
			if ((flags & format_raw) == 0) writer.write('\n');
			break;

		case node_cdata:
			text_output_cdata(writer, node.value());
			if ((flags & format_raw) == 0) writer.write('\n');
			break;

		case node_comment:
			writer.write('<', '!', '-', '-');
			writer.write(node.value());
			writer.write('-', '-', '>');
			if ((flags & format_raw) == 0) writer.write('\n');
			break;

		case node_pi:
		case node_declaration:
			writer.write('<', '?');
			writer.write(node.name()[0] ? node.name() : default_name);

			if (node.type() == node_declaration)
			{
				node_output_attributes(writer, node, flags);
			}
			else if (node.value()[0])
			{
				writer.write(' ');
				writer.write(node.value());
			}

			writer.write('?', '>');
			if ((flags & format_raw) == 0) writer.write('\n');
			break;

		case node_doctype:
			writer.write('<', '!', 'D', 'O', 'C');
			writer.write('T', 'Y', 'P', 'E');

			if (node.value()[0])
			{
				writer.write(' ');
				writer.write(node.value());
			}

			writer.write('>');
			if ((flags & format_raw) == 0) writer.write('\n');
			break;

		default:
			assert(!"Invalid node type");
		}
	}